

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfocusframe.cpp
# Opt level: O2

bool __thiscall QFocusFrame::eventFilter(QFocusFrame *this,QObject *o,QEvent *e)

{
  short sVar1;
  QFocusFramePrivate *this_00;
  int iVar2;
  QStyle *pQVar3;
  QPalette *palette;
  QWidget *this_01;
  QWidget *w;
  
  this_00 = *(QFocusFramePrivate **)&(this->super_QWidget).field_0x8;
  this_01 = this_00->widget;
  if (this_01 != (QWidget *)o) {
    if (this_00->showFrameAboveWidget != true) {
      return false;
    }
    if (1 < *(ushort *)(e + 8) - 0xd) {
      if (*(ushort *)(e + 8) != 0x7e) {
        return false;
      }
LAB_003716ef:
      QWidget::raise(&this->super_QWidget,(int)o);
      return false;
    }
switchD_003716a4_caseD_d:
    QFocusFramePrivate::updateSize(this_00);
    return false;
  }
  sVar1 = *(short *)(e + 8);
  switch(sVar1) {
  case 0xd:
  case 0xe:
    goto switchD_003716a4_caseD_d;
  case 0xf:
  case 0x13:
  case 0x14:
    goto switchD_003716a4_caseD_f;
  case 0x10:
    this_01 = (QWidget *)0x0;
    break;
  case 0x11:
    QFocusFramePrivate::update(this_00);
    QWidget::show(&this->super_QWidget);
    return false;
  case 0x15:
    if (this_00->showFrameAboveWidget != true) {
      QFocusFramePrivate::update(this_00);
      return false;
    }
    setWidget(this,(QWidget *)0x0);
    break;
  default:
    if (sVar1 == 0x27) {
      palette = QWidget::palette(this_01);
      QWidget::setPalette(&this->super_QWidget,palette);
      return false;
    }
    if (sVar1 != 100) {
      if (sVar1 != 0x7e) {
        return false;
      }
      pQVar3 = QWidget::style(&this->super_QWidget);
      o = (QObject *)0x4c;
      iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x4c,0,this,0);
      if (iVar2 == 0) {
        QWidget::stackUnder(&this->super_QWidget,this_00->widget);
        return false;
      }
      goto LAB_003716ef;
    }
  case 0x12:
    QWidget::hide(&this->super_QWidget);
    return false;
  }
  setWidget(this,this_01);
switchD_003716a4_caseD_f:
  return false;
}

Assistant:

bool
QFocusFrame::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QFocusFrame);
    if (o == d->widget) {
        switch(e->type()) {
        case QEvent::Move:
        case QEvent::Resize:
            d->updateSize();
            break;
        case QEvent::Hide:
        case QEvent::StyleChange:
            hide();
            break;
        case QEvent::ParentChange:
            if (d->showFrameAboveWidget) {
                QWidget *w = d->widget;
                setWidget(nullptr);
                setWidget(w);
            } else {
                d->update();
            }
            break;
        case QEvent::Show:
            d->update();
            show();
            break;
        case QEvent::PaletteChange:
            setPalette(d->widget->palette());
            break;
        case QEvent::ZOrderChange:
            if (style()->styleHint(QStyle::SH_FocusFrame_AboveWidget, nullptr, this))
                raise();
            else
                stackUnder(d->widget);
            break;
        case QEvent::Destroy:
            setWidget(nullptr);
            break;
        default:
            break;
        }
    } else if (d->showFrameAboveWidget) {
        // Handle changes in the parent widgets we are monitoring.
        switch(e->type()) {
        case QEvent::Move:
        case QEvent::Resize:
            d->updateSize();
            break;
        case QEvent::ZOrderChange:
            raise();
            break;
        default:
            break;
        }
    }
    return false;
}